

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O3

bool Disassembler::labelExists(int line)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((long)labels_abi_cxx11_.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)labels_abi_cxx11_.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    return false;
  }
  uVar4 = ((long)labels_abi_cxx11_.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)labels_abi_cxx11_.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  bVar2 = true;
  if ((labels_abi_cxx11_.
       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->first != line + 2) {
    uVar1 = 1;
    ppVar3 = labels_abi_cxx11_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar5 = uVar1;
      ppVar3 = ppVar3 + 1;
      if (uVar4 + (uVar4 == 0) == uVar5) break;
      uVar1 = uVar5 + 1;
    } while (ppVar3->first != line + 2);
    bVar2 = uVar5 <= uVar4 && uVar4 - uVar5 != 0;
  }
  return bVar2;
}

Assistant:

bool Disassembler::labelExists(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2)// .globl e .text
      return true;
  return false;
}